

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

string * __thiscall DDSHeader::ToString_abi_cxx11_(string *__return_storage_ptr__,DDSHeader *this)

{
  long lVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 uVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  ToStringArray_abi_cxx11_(&local_48,this);
  if (DAT_00143538 != DDSInfo::column_names_abi_cxx11_) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      local_b0[0] = local_a0;
      lVar1 = *(long *)(DDSInfo::column_names_abi_cxx11_ + uVar7 * 0x20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,lVar1,
                 *(long *)(DDSInfo::column_names_abi_cxx11_ + 8 + uVar7 * 0x20) + lVar1);
      std::__cxx11::string::append((char *)local_b0);
      if ((ulong)((long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != local_70) {
          operator_delete(pcVar2);
        }
        _Unwind_Resume(uVar4);
      }
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_b0,
                                  (ulong)local_48.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                         _M_dataplus._M_p);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_58 = *plVar5;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar5;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)(DAT_00143538 - DDSInfo::column_names_abi_cxx11_ >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ToString() {
    std::string output("");
    const auto& variable_strings(this->ToStringArray());
    for(unsigned int index=0; index<DDSInfo::column_names.size();++index)
      output.append(DDSInfo::column_names.at(index) + ": " + variable_strings.at(index) + "\n");
    return output;
  }